

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::json_abi_v3_11_3::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  bool bVar1;
  ulong in_RCX;
  ulong in_RDX;
  int in_ESI;
  long in_RDI;
  ulong in_R8;
  ulong in_R9;
  ulong local_28;
  
  if (in_ESI < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x4431,"GGML_ASSERT(%s) failed","len >= 1");
  }
  if (in_RCX < in_RDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x4432,"GGML_ASSERT(%s) failed","dist <= delta");
  }
  if (in_RCX < in_R8) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x4433,"GGML_ASSERT(%s) failed","rest <= delta");
  }
  local_28 = in_R8;
  if (in_R9 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x4434,"GGML_ASSERT(%s) failed","ten_k > 0");
  }
  while( true ) {
    bVar1 = false;
    if (((local_28 < in_RDX) && (bVar1 = false, in_R9 <= in_RCX - local_28)) &&
       (bVar1 = true, in_RDX <= local_28 + in_R9)) {
      bVar1 = (local_28 + in_R9) - in_RDX < in_RDX - local_28;
    }
    if (!bVar1) break;
    if (*(char *)(in_RDI + (in_ESI + -1)) == '0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,0x444d,"GGML_ASSERT(%s) failed","buf[len - 1] != \'0\'");
    }
    *(char *)(in_RDI + (in_ESI + -1)) = *(char *)(in_RDI + (in_ESI + -1)) + -1;
    local_28 = in_R9 + local_28;
  }
  return;
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
                         std::uint64_t rest, std::uint64_t ten_k)
{
    JSON_ASSERT(len >= 1);
    JSON_ASSERT(dist <= delta);
    JSON_ASSERT(rest <= delta);
    JSON_ASSERT(ten_k > 0);

    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    //                                  ten_k
    //                                <------>
    //                                       <---- rest ---->
    // --------------[------------------+----+--------------]--------------
    //                                  w    V
    //                                       = buf * 10^k
    //
    // ten_k represents a unit-in-the-last-place in the decimal representation
    // stored in buf.
    // Decrement buf by ten_k while this takes buf closer to w.

    // The tests are written in this order to avoid overflow in unsigned
    // integer arithmetic.

    while (rest < dist
            && delta - rest >= ten_k
            && (rest + ten_k < dist || dist - rest > rest + ten_k - dist))
    {
        JSON_ASSERT(buf[len - 1] != '0');
        buf[len - 1]--;
        rest += ten_k;
    }
}